

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatWriter.cpp
# Opt level: O3

void __thiscall OpenMD::StatWriter::writeArray(StatWriter *this,int i)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  vector<double,_std::allocator<double>_> s;
  vector<double,_std::allocator<double>_> local_68;
  string local_50;
  
  Stats::getArrayData(&local_68,this->stats_,i);
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar2 = 0;
    uVar3 = 1;
    do {
      if ((ulong)ABS(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar2]) < 0x7ff0000000000000) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"\t",1);
        std::ostream::_M_insert<double>
                  (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar2]);
      }
      else {
        Stats::getTitle_abi_cxx11_(&local_50,this->stats_,i);
        snprintf(painCave.errMsg,2000,"StatWriter detected a numerical error writing: %s",
                 local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        painCave.isFatal = 1;
        simError();
      }
      bVar1 = uVar3 < (ulong)((long)local_68.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_68.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3);
      uVar2 = uVar3;
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (bVar1);
  }
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void StatWriter::writeArray(int i) {
    std::vector<RealType> s = stats_->getArrayData(i);

    for (unsigned int j = 0; j < s.size(); ++j) {
      if (std::isinf(s[j]) || std::isnan(s[j])) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "StatWriter detected a numerical error writing: %s",
                 stats_->getTitle(i).c_str());
        painCave.isFatal = 1;
        simError();
      } else {
        statfile_ << "\t" << s[j];
      }
    }
  }